

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

void strRev(char *str)

{
  ulong uVar1;
  long in_RDI;
  size_t j;
  size_t i;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = strLen((char *)0x11d76c);
  while (local_10 + 1U < local_18) {
    uVar1 = local_18 - 1;
    *(byte *)(in_RDI + local_10) = *(byte *)(in_RDI + local_10) ^ *(byte *)(in_RDI + -1 + local_18);
    *(byte *)(in_RDI + uVar1) = *(byte *)(in_RDI + uVar1) ^ *(byte *)(in_RDI + local_10);
    *(byte *)(in_RDI + local_10) = *(byte *)(in_RDI + local_10) ^ *(byte *)(in_RDI + uVar1);
    local_18 = uVar1;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void strRev(char* str)
{
	size_t i, j;
	ASSERT(strIsValid(str));
	for (i = 0, j = strLen(str); i + 1 < j;)
	{
		str[i] ^= str[--j];
		str[j] ^= str[i];
		str[i++] ^= str[j];
	}
}